

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connecion.cpp
# Opt level: O1

void __thiscall
Markov::Connection::Output
          (Connection *this,string *name,ostream *ostr,optional<unsigned_long_long> maxgenLocal)

{
  _func_int_sqlite3_stmt_ptr *p_Var1;
  ulong uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *pcVar4;
  database *pdVar5;
  Connection *pCVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long *plVar10;
  undefined8 *puVar11;
  long lVar12;
  reference pvVar13;
  database_binder *binder;
  MarkovExceptionTemplate<Markov::Exception::ConfigNotFoundM> *this_00;
  ulong uVar14;
  element_type *peVar15;
  size_type *psVar16;
  long *plVar17;
  size_type sVar18;
  _Head_base<1UL,_int_(*)(sqlite3_stmt_*),_false> _Var19;
  undefined8 uVar20;
  anon_class_8_1_a8c68091 call_back;
  ulong uVar21;
  uint __val;
  unsigned_long_long uVar22;
  long lVar23;
  uint __len;
  bool bVar24;
  str_ref sql;
  str_ref sql_00;
  str_ref sql_01;
  rowid_t id;
  string stringRes;
  database_binder pstm;
  database_binder dictStrPastm;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  MarkovDeque dq;
  string pstmString;
  optional<Markov::ChainSettings> conf;
  string local_278;
  database_binder local_258;
  undefined1 local_228 [16];
  _Head_base<1UL,_int_(*)(sqlite3_stmt_*),_false> local_218;
  _Head_base<0UL,_sqlite3_stmt_*,_false> _Stack_210;
  undefined1 local_1f8 [16];
  _Head_base<1UL,_int_(*)(sqlite3_stmt_*),_false> local_1e8;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined1 local_1c8 [40];
  undefined1 local_1a0 [40];
  _Map_pointer local_178;
  ostream *local_150;
  char *local_148;
  size_t local_140;
  char local_138;
  undefined7 uStack_137;
  Connection *local_128;
  _Storage<unsigned_long_long,_true> local_120;
  string local_118;
  undefined1 local_f8 [160];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  bool local_38;
  
  local_150 = ostr;
  local_128 = this;
  GetConfig((optional<Markov::ChainSettings> *)local_f8,this,name);
  if (local_38 == false) {
    this_00 = (MarkovExceptionTemplate<Markov::Exception::ConfigNotFoundM> *)
              __cxa_allocate_exception(0x10);
    MarkovExceptionTemplate<Markov::Exception::ConfigNotFoundM>::MarkovExceptionTemplate(this_00);
    __cxa_throw(this_00,&
                        _ZTIN6Markov23MarkovExceptionTemplateIXadsoKcL_ZNS_9Exception15ConfigNotFoundMEEEEEE
                ,std::logic_error::~logic_error);
  }
  local_120._M_value =
       maxgenLocal.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long_long>._M_payload;
  if (((undefined1  [16])
       maxgenLocal.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long_long> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    local_120 = (_Storage<unsigned_long_long,_true>)local_f8._112_8_;
  }
  local_148 = &local_138;
  local_140 = 0;
  local_138 = '\0';
  local_1c8._16_8_ = (pointer)0x0;
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8._8_8_ = (pointer)0x0;
  if (local_f8._64_4_ != 0) {
    __val = 1;
    do {
      __len = 1;
      if (9 < __val) {
        uVar14 = (ulong)__val;
        uVar7 = 4;
        do {
          __len = uVar7;
          uVar8 = (uint)uVar14;
          if (uVar8 < 100) {
            __len = __len - 2;
            goto LAB_0012b566;
          }
          if (uVar8 < 1000) {
            __len = __len - 1;
            goto LAB_0012b566;
          }
          if (uVar8 < 10000) goto LAB_0012b566;
          uVar14 = uVar14 / 10000;
          uVar7 = __len + 4;
        } while (99999 < uVar8);
        __len = __len + 1;
      }
LAB_0012b566:
      local_1f8._0_8_ = &local_1e8;
      std::__cxx11::string::_M_construct((ulong)local_1f8,(char)__len);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1f8._0_8_,__len,__val);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)local_1f8,0,(char *)0x0,0x140557);
      peVar15 = (element_type *)(plVar10 + 2);
      if ((element_type *)*plVar10 == peVar15) {
        local_218._M_head_impl = *(_func_int_sqlite3_stmt_ptr **)peVar15;
        _Stack_210._M_head_impl = (sqlite3_stmt *)plVar10[3];
        local_228._0_8_ = (element_type *)&local_218;
      }
      else {
        local_218._M_head_impl = *(_func_int_sqlite3_stmt_ptr **)peVar15;
        local_228._0_8_ = (element_type *)*plVar10;
      }
      local_228._8_8_ = plVar10[1];
      *plVar10 = (long)peVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_228);
      psVar16 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar16) {
        local_1a0._16_8_ = *psVar16;
        local_1a0._24_8_ = plVar10[3];
        local_1a0._0_8_ = local_1a0 + 0x10;
      }
      else {
        local_1a0._16_8_ = *psVar16;
        local_1a0._0_8_ = (size_type *)*plVar10;
      }
      local_1a0._8_8_ = plVar10[1];
      *plVar10 = (long)psVar16;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0);
      if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
        operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
      }
      if ((element_type *)local_228._0_8_ != (element_type *)&local_218) {
        operator_delete((void *)local_228._0_8_,(ulong)(local_218._M_head_impl + 1));
      }
      if ((element_type *)local_1f8._0_8_ != (element_type *)&local_1e8) {
        operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._M_head_impl + 1));
      }
      bVar24 = __val < (uint)local_f8._64_4_;
      __val = __val + 1;
    } while (bVar24);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_258,
                 "SELECT rstr FROM ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_f8 + 0x80));
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_258);
  peVar15 = (element_type *)(plVar10 + 2);
  if ((element_type *)*plVar10 == peVar15) {
    local_1e8._M_head_impl = *(_func_int_sqlite3_stmt_ptr **)peVar15;
    uStack_1e0 = (undefined4)plVar10[3];
    uStack_1dc = *(undefined4 *)((long)plVar10 + 0x1c);
    local_1f8._0_8_ = (element_type *)&local_1e8;
  }
  else {
    local_1e8._M_head_impl = *(_func_int_sqlite3_stmt_ptr **)peVar15;
    local_1f8._0_8_ = (element_type *)*plVar10;
  }
  local_1f8._8_8_ = plVar10[1];
  *plVar10 = (long)peVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118," AND ","");
  anon_unknown.dwarf_2079b::joinStr
            (&local_278,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1c8,&local_118);
  p_Var1 = (_func_int_sqlite3_stmt_ptr *)
           ((long)(_func_int ***)local_1f8._8_8_ + local_278._M_string_length);
  _Var19._M_head_impl = (_func_int_sqlite3_stmt_ptr *)0xf;
  if ((element_type *)local_1f8._0_8_ != (element_type *)&local_1e8) {
    _Var19._M_head_impl = local_1e8._M_head_impl;
  }
  if (_Var19._M_head_impl < p_Var1) {
    uVar20 = (_func_int_sqlite3_stmt_ptr *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      uVar20 = local_278.field_2._M_allocated_capacity;
    }
    if (p_Var1 <= (ulong)uVar20) {
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,local_1f8._0_8_);
      goto LAB_0012b7fe;
    }
  }
  puVar11 = (undefined8 *)
            std::__cxx11::string::_M_append(local_1f8,(ulong)local_278._M_dataplus._M_p);
LAB_0012b7fe:
  local_228._0_8_ = &local_218;
  peVar15 = (element_type *)(puVar11 + 2);
  if ((element_type *)*puVar11 == peVar15) {
    local_218._M_head_impl = *(_func_int_sqlite3_stmt_ptr **)peVar15;
    _Stack_210._M_head_impl = (sqlite3_stmt *)puVar11[3];
  }
  else {
    local_218._M_head_impl = *(_func_int_sqlite3_stmt_ptr **)peVar15;
    local_228._0_8_ = (element_type *)*puVar11;
  }
  local_228._8_8_ = puVar11[1];
  *puVar11 = peVar15;
  puVar11[1] = 0;
  *peVar15 = (element_type)0x0;
  plVar10 = (long *)std::__cxx11::string::append(local_228);
  pcVar4 = local_1a0 + 0x10;
  psVar16 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar16) {
    local_1a0._16_8_ = *psVar16;
    local_1a0._24_8_ = plVar10[3];
    local_1a0._0_8_ = pcVar4;
  }
  else {
    local_1a0._16_8_ = *psVar16;
    local_1a0._0_8_ = (size_type *)*plVar10;
  }
  local_1a0._8_8_ = plVar10[1];
  *plVar10 = (long)psVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_148,(string *)local_1a0);
  if ((char *)local_1a0._0_8_ != pcVar4) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  if ((element_type *)local_228._0_8_ != (element_type *)&local_218) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_218._M_head_impl + 1));
  }
  paVar3 = &local_278.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar3) {
    operator_delete(local_278._M_dataplus._M_p,(ulong)(local_278.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((element_type *)local_1f8._0_8_ != (element_type *)&local_1e8) {
    operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._M_head_impl + 1));
  }
  pCVar6 = local_128;
  if (local_258._db.super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)&local_258._stmt) {
    operator_delete(local_258._db.super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    CONCAT71(local_258._stmt._M_t.
                             super___uniq_ptr_impl<sqlite3_stmt,_int_(*)(sqlite3_stmt_*)>._M_t.
                             super__Tuple_impl<0UL,_sqlite3_stmt_*,_int_(*)(sqlite3_stmt_*)>.
                             super__Tuple_impl<1UL,_int_(*)(sqlite3_stmt_*)>.
                             super__Head_base<1UL,_int_(*)(sqlite3_stmt_*),_false>._M_head_impl.
                             _1_7_,local_258._stmt._M_t.
                                   super___uniq_ptr_impl<sqlite3_stmt,_int_(*)(sqlite3_stmt_*)>._M_t
                                   .super__Tuple_impl<0UL,_sqlite3_stmt_*,_int_(*)(sqlite3_stmt_*)>.
                                   super__Tuple_impl<1UL,_int_(*)(sqlite3_stmt_*)>.
                                   super__Head_base<1UL,_int_(*)(sqlite3_stmt_*),_false>.
                                   _M_head_impl._0_1_) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1c8);
  sql._M_str = local_148;
  sql._M_len = local_140;
  sqlite::database::operator<<
            ((database_binder *)local_228,
             (pCVar6->db).super___shared_ptr<sqlite::database,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             sql);
  pdVar5 = (pCVar6->db).super___shared_ptr<sqlite::database,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_258,
                 "SELECT str FROM ",&local_58);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_258);
  psVar16 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar16) {
    local_1a0._16_8_ = *psVar16;
    local_1a0._24_8_ = plVar10[3];
    local_1a0._0_8_ = pcVar4;
  }
  else {
    local_1a0._16_8_ = *psVar16;
    local_1a0._0_8_ = (size_type *)*plVar10;
  }
  local_1a0._8_8_ = plVar10[1];
  *plVar10 = (long)psVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  sql_00._M_str = (char *)local_1a0._0_8_;
  sql_00._M_len = local_1a0._8_8_;
  sqlite::database::operator<<((database_binder *)local_1f8,pdVar5,sql_00);
  if ((char *)local_1a0._0_8_ != pcVar4) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  if (local_258._db.super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)&local_258._stmt) {
    operator_delete(local_258._db.super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    CONCAT71(local_258._stmt._M_t.
                             super___uniq_ptr_impl<sqlite3_stmt,_int_(*)(sqlite3_stmt_*)>._M_t.
                             super__Tuple_impl<0UL,_sqlite3_stmt_*,_int_(*)(sqlite3_stmt_*)>.
                             super__Tuple_impl<1UL,_int_(*)(sqlite3_stmt_*)>.
                             super__Head_base<1UL,_int_(*)(sqlite3_stmt_*),_false>._M_head_impl.
                             _1_7_,local_258._stmt._M_t.
                                   super___uniq_ptr_impl<sqlite3_stmt,_int_(*)(sqlite3_stmt_*)>._M_t
                                   .super__Tuple_impl<0UL,_sqlite3_stmt_*,_int_(*)(sqlite3_stmt_*)>.
                                   super__Tuple_impl<1UL,_int_(*)(sqlite3_stmt_*)>.
                                   super__Head_base<1UL,_int_(*)(sqlite3_stmt_*),_false>.
                                   _M_head_impl._0_1_) + 1);
  }
  local_258._db.super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  std::deque<long_long,_std::allocator<long_long>_>::deque
            ((deque<long_long,_std::allocator<long_long>_> *)local_1a0,(ulong)(uint)local_f8._64_4_,
             (value_type_conflict2 *)&local_258,(allocator_type *)&local_278);
  if ((bool)local_f8[0x78] == true) {
    pdVar5 = (pCVar6->db).super___shared_ptr<sqlite::database,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                   "SELECT * FROM ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_f8 + 0x80));
    plVar10 = (long *)std::__cxx11::string::append(local_1c8);
    plVar17 = plVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar17) {
      local_278.field_2._M_allocated_capacity = *plVar17;
      local_278.field_2._8_8_ = plVar10[3];
      local_278._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_278.field_2._M_allocated_capacity = *plVar17;
      local_278._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_278._M_string_length = plVar10[1];
    *plVar10 = (long)plVar17;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    sql_01._M_str = local_278._M_dataplus._M_p;
    sql_01._M_len = local_278._M_string_length;
    sqlite::database::operator<<(&local_258,pdVar5,sql_01);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar3) {
      operator_delete(local_278._M_dataplus._M_p,
                      (ulong)(local_278.field_2._M_allocated_capacity + 1));
    }
    if ((pointer)local_1c8._0_8_ != (pointer)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
    }
    sqlite::detail::operator>>(&local_258,(anon_class_8_1_a8c68091)&local_278);
    if (local_f8._64_4_ != 0) {
      lVar23 = 0;
      uVar14 = 0;
      do {
        lVar12 = (long)(local_1a0._16_8_ - local_1a0._24_8_) >> 3;
        uVar2 = uVar14 + lVar12;
        if (uVar2 < 0x40) {
          call_back.value = (longlong *)(local_1a0._16_8_ + lVar23);
        }
        else {
          uVar21 = (uVar2 >> 6) + 0xfc00000000000000;
          if (0 < (long)uVar2) {
            uVar21 = uVar2 >> 6;
          }
          call_back.value = local_178[uVar21] + lVar12 + uVar21 * -0x40 + uVar14;
        }
        sqlite::detail::operator>>(&local_258,call_back);
        uVar14 = uVar14 + 1;
        lVar23 = lVar23 + 8;
      } while (uVar14 < (uint)local_f8._64_4_);
    }
    sqlite::database_binder::~database_binder(&local_258);
  }
  local_258._db.super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_258._stmt;
  local_258._db.super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_258._stmt._M_t.super___uniq_ptr_impl<sqlite3_stmt,_int_(*)(sqlite3_stmt_*)>._M_t.
  super__Tuple_impl<0UL,_sqlite3_stmt_*,_int_(*)(sqlite3_stmt_*)>.
  super__Tuple_impl<1UL,_int_(*)(sqlite3_stmt_*)>.
  super__Head_base<1UL,_int_(*)(sqlite3_stmt_*),_false>._M_head_impl._0_1_ = 0;
  if (local_f8._64_4_ != 0) {
    sVar18 = 0;
    do {
      pvVar13 = std::deque<long_long,_std::allocator<long_long>_>::at
                          ((deque<long_long,_std::allocator<long_long>_> *)local_1a0,sVar18);
      sqlite::operator<<((database_binder *)local_228,pvVar13);
      sVar18 = sVar18 + 1;
    } while (sVar18 < (uint)local_f8._64_4_);
  }
  local_278._M_dataplus._M_p = (pointer)0x0;
  sqlite::detail::operator>>((database_binder *)local_228,(anon_class_8_1_a8c68091)&local_278);
  local_1c8._0_8_ = local_278._M_dataplus._M_p;
  if (local_278._M_dataplus._M_p != (pointer)0x0) {
    uVar22 = 0;
    do {
      local_1c8._0_8_ = local_278._M_dataplus._M_p;
      binder = sqlite::operator<<((database_binder *)local_1f8,(longlong *)local_1c8);
      sqlite::detail::operator>>
                (binder,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_258);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_150,
                 (char *)local_258._db.super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,
                 (long)local_258._db.super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
      iVar9 = std::__cxx11::string::compare((char *)&local_258);
      if (iVar9 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_150,(char *)local_f8._32_8_,local_f8._40_8_);
      }
      if ((local_120._M_value != 0) && (uVar22 = uVar22 + 1, uVar22 == local_120._M_value)) break;
      anon_unknown.dwarf_2079b::shiftDeque<long_long>
                ((deque<long_long,_std::allocator<long_long>_> *)local_1a0,(longlong *)local_1c8);
      if (local_f8._64_4_ != 0) {
        sVar18 = 0;
        do {
          pvVar13 = std::deque<long_long,_std::allocator<long_long>_>::at
                              ((deque<long_long,_std::allocator<long_long>_> *)local_1a0,sVar18);
          sqlite::operator<<((database_binder *)local_228,pvVar13);
          sVar18 = sVar18 + 1;
        } while (sVar18 < (uint)local_f8._64_4_);
      }
      local_278._M_dataplus._M_p = (pointer)0x0;
      sqlite::detail::operator>>((database_binder *)local_228,(anon_class_8_1_a8c68091)&local_278);
      local_1c8._0_8_ = local_278._M_dataplus._M_p;
    } while (local_278._M_dataplus._M_p != (pointer)0x0);
  }
  if (local_258._db.super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)&local_258._stmt) {
    operator_delete(local_258._db.super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    CONCAT71(local_258._stmt._M_t.
                             super___uniq_ptr_impl<sqlite3_stmt,_int_(*)(sqlite3_stmt_*)>._M_t.
                             super__Tuple_impl<0UL,_sqlite3_stmt_*,_int_(*)(sqlite3_stmt_*)>.
                             super__Tuple_impl<1UL,_int_(*)(sqlite3_stmt_*)>.
                             super__Head_base<1UL,_int_(*)(sqlite3_stmt_*),_false>._M_head_impl.
                             _1_7_,local_258._stmt._M_t.
                                   super___uniq_ptr_impl<sqlite3_stmt,_int_(*)(sqlite3_stmt_*)>._M_t
                                   .super__Tuple_impl<0UL,_sqlite3_stmt_*,_int_(*)(sqlite3_stmt_*)>.
                                   super__Tuple_impl<1UL,_int_(*)(sqlite3_stmt_*)>.
                                   super__Head_base<1UL,_int_(*)(sqlite3_stmt_*),_false>.
                                   _M_head_impl._0_1_) + 1);
  }
  std::_Deque_base<long_long,_std::allocator<long_long>_>::~_Deque_base
            ((_Deque_base<long_long,_std::allocator<long_long>_> *)local_1a0);
  sqlite::database_binder::~database_binder((database_binder *)local_1f8);
  sqlite::database_binder::~database_binder((database_binder *)local_228);
  if (local_148 != &local_138) {
    operator_delete(local_148,CONCAT71(uStack_137,local_138) + 1);
  }
  if (local_38 == true) {
    std::_Optional_payload_base<Markov::ChainSettings>::_M_destroy
              ((_Optional_payload_base<Markov::ChainSettings> *)local_f8);
  }
  return;
}

Assistant:

void Connection::Output(const std::string& name, std::ostream& ostr, std::optional<unsigned long long int> maxgenLocal) {
		auto conf = GetConfig(name);

		if (!conf) throw Exception::ConfigNotFound();
		unsigned long long int maxgen = (maxgenLocal ? (*maxgenLocal) : conf->maxgen);

		std::string pstmString;
			{
			std::vector<std::string> vec;

			for (int i = 1; i <= conf->N; ++i) {
					vec.push_back("str" + std::to_string(i) + "=?"); // All "base" strings
					}

			pstmString = "SELECT rstr FROM " + conf->sqlite_table + " WHERE " + joinStr(vec, " AND ") + " ORDER BY RANDOM() LIMIT 1;";
			}

		auto pstm = *db << pstmString;
		auto dictStrPastm = *db << "SELECT str FROM " + conf->sqlite_table_dict + " WHERE rowid=? LIMIT 1;";

		MarkovDeque dq(conf->N, 0);

		if (conf->rndstart) {
				auto row = *db << "SELECT * FROM " + conf->sqlite_table + " ORDER BY RANDOM() LIMIT 1;";
				rowid_t id;
				row >> id;

				for (unsigned int i = 0; i < conf->N; ++i) row >> dq[i];
				}

		auto outGet = [&conf, &pstm, &dq]() {
			for (size_t i = 0; i < conf->N; ++i) {
					pstm << dq.at(i);
					}

			rowid_t res = 0;
			pstm >> res;
			return res;
			};

		unsigned long long int n = 0;
		std::string stringRes;

		for (rowid_t res = outGet(); res != 0; res = outGet()) {
				dictStrPastm << res >> stringRes;
				ostr << stringRes;

				if (stringRes != "\n") ostr << conf->prefixmiddle;

				if (maxgen > 0 && ++n == maxgen) {
						return;
						}

				shiftDeque(dq, res);
				}
		}